

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetOProbabilitiesExactScopes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Aii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Yii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Oii,Index *oIndex)

{
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *pMVar1;
  CPDDiscreteInterface *pCVar2;
  Index IVar3;
  size_type __n;
  ulong uVar4;
  double extraout_XMM0_Qa;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  value_type_conflict3 local_38;
  
  pMVar1 = this->_m_madp;
  local_48 = Yii;
  local_40 = Oii;
  __n = (**(code **)(*(long *)((long)&pMVar1->field_0x0 + *(long *)((long)*pMVar1 + -0x188)) + 0xc0)
        )((long)&pMVar1->field_0x0 + *(long *)((long)*pMVar1 + -0x188),*oIndex);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,&local_38,&local_49);
  IVar3 = IndividualToJointOiiIndices(this,*oIndex,Xii,Aii,local_48,local_40);
  if (__n != 0) {
    uVar4 = 0;
    do {
      pCVar2 = (this->_m_O_CPDs).
               super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*oIndex];
      (*pCVar2->_vptr_CPDDiscreteInterface[2])(pCVar2,uVar4,(ulong)IVar3);
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4] = extraout_XMM0_Qa;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < __n);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> TwoStageDynamicBayesianNetwork::
GetOProbabilitiesExactScopes( 
                    const vector<Index>& Xii,
                    const vector<Index>& Aii,
                    const vector<Index>& Yii,
                    const vector<Index>& Oii,
                    const Index& oIndex //agentI
                ) const
{
    size_t nrVals = _m_madp->GetNrObservations(oIndex);
    vector<double> probs(nrVals, 0.0);
    Index iiI = IndividualToJointOiiIndices(oIndex, Xii ,Aii, Yii, Oii);
    for(Index valI=0; valI < nrVals; valI++)
    {
        probs[valI] = _m_O_CPDs[oIndex]->Get(valI, iiI);
    }
    return(probs);
}